

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtrBasic.c
# Opt level: O3

MtrNode * Mtr_CreateLastChild(MtrNode *parent)

{
  MtrNode *pMVar1;
  MtrNode *pMVar2;
  MtrNode *pMVar3;
  MtrNode **ppMVar4;
  
  pMVar2 = (MtrNode *)malloc(0x30);
  if (pMVar2 != (MtrNode *)0x0) {
    pMVar2->flags = 0;
    pMVar2->child = (MtrNode *)0x0;
    pMVar2->elder = (MtrNode *)0x0;
    pMVar2->younger = (MtrNode *)0x0;
    pMVar1 = parent->child;
    if (parent->child == (MtrNode *)0x0) {
      ppMVar4 = &parent->child;
      pMVar3 = (MtrNode *)0x0;
    }
    else {
      do {
        pMVar3 = pMVar1;
        pMVar1 = pMVar3->younger;
      } while (pMVar3->younger != (MtrNode *)0x0);
      ppMVar4 = &pMVar3->younger;
    }
    *ppMVar4 = pMVar2;
    pMVar2->elder = pMVar3;
    pMVar2->parent = parent;
  }
  return pMVar2;
}

Assistant:

MtrNode *
Mtr_CreateLastChild(
  MtrNode * parent)
{
    MtrNode *child;

    child = Mtr_AllocNode();
    if (child == NULL) return(NULL);

    child->child = child->younger = child->elder = NULL;
    child->flags = 0;
    Mtr_MakeLastChild(parent,child);
    return(child);

}